

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O1

void __thiscall CLIntercept::initBuiltinKernelOverrides(CLIntercept *this,cl_context context)

{
  size_t sVar1;
  int iVar2;
  cl_int cVar3;
  mapped_type *ppSVar4;
  mapped_type pSVar5;
  cl_program p_Var6;
  void *pvVar7;
  char *__s;
  size_t sVar8;
  cl_kernel p_Var9;
  undefined8 uVar10;
  ulong uVar11;
  CBuiltinKernelOverridesMap *this_00;
  pthread_mutex_t *__mutex;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  cl_int errorCode;
  cl_uint numDevices;
  size_t buildLogSize;
  size_t programStringLength;
  char *pProgramString;
  cl_int local_94;
  CLIntercept *local_90;
  pthread_mutex_t *local_88;
  uint local_7c;
  cl_context local_78;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  size_t local_50 [2];
  char *local_40;
  CBuiltinKernelOverridesMap *local_38;
  
  __mutex = (pthread_mutex_t *)&this->m_Mutex;
  local_90 = this;
  local_78 = context;
  iVar2 = pthread_mutex_lock(__mutex);
  if (iVar2 == 0) {
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_70,"Initializing builtin kernel overrides...\n","");
    log(local_90,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
    if (local_70[0] != local_60) {
      operator_delete(local_70[0]);
    }
    local_94 = 0;
    this_00 = &local_90->m_BuiltinKernelOverridesMap;
    ppSVar4 = std::
              map<_cl_context_*,_CLIntercept::SBuiltinKernelOverrides_*,_std::less<_cl_context_*>,_std::allocator<std::pair<_cl_context_*const,_CLIntercept::SBuiltinKernelOverrides_*>_>_>
              ::operator[](this_00,&local_78);
    pSVar5 = *ppSVar4;
    if (pSVar5 != (mapped_type)0x0) {
      local_94 = (*(local_90->m_Dispatch).clReleaseKernel)
                           (pSVar5->Kernel_block_motion_estimate_intel);
      local_94 = (*(local_90->m_Dispatch).clReleaseProgram)(pSVar5->Program);
      operator_delete(pSVar5);
      ppSVar4 = std::
                map<_cl_context_*,_CLIntercept::SBuiltinKernelOverrides_*,_std::less<_cl_context_*>,_std::allocator<std::pair<_cl_context_*const,_CLIntercept::SBuiltinKernelOverrides_*>_>_>
                ::operator[](this_00,&local_78);
      *ppSVar4 = (mapped_type)0x0;
    }
    pSVar5 = (mapped_type)operator_new(0x10);
    pSVar5->Program = (cl_program)0x0;
    pSVar5->Kernel_block_motion_estimate_intel = (cl_kernel)0x0;
    local_40 = (char *)0x0;
    local_50[1] = 0;
    if (local_94 == 0) {
      local_40 = &_binary_kernels_builtin_kernels_cl_start;
      local_50[1] = 0xc0f;
      p_Var6 = (*(local_90->m_Dispatch).clCreateProgramWithSource)
                         (local_78,1,&local_40,local_50 + 1,&local_94);
      pSVar5->Program = p_Var6;
    }
    if ((local_94 == 0) &&
       (local_94 = (*(local_90->m_Dispatch).clBuildProgram)
                             (pSVar5->Program,0,(cl_device_id *)0x0,
                              "-Dcl_intel_device_side_vme_enable -DHW_NULL_CHECK",
                              (_func_void_cl_program_void_ptr *)0x0,(void *)0x0), local_94 != 0)) {
      local_7c = 0;
      local_88 = __mutex;
      local_38 = this_00;
      (*(local_90->m_Dispatch).clGetContextInfo)(local_78,0x1083,4,&local_7c,(size_t *)0x0);
      this_00 = local_38;
      __mutex = local_88;
      if ((ulong)local_7c != 0) {
        uVar11 = (ulong)local_7c << 3;
        pvVar7 = operator_new__(uVar11);
        cVar3 = (*(local_90->m_Dispatch).clGetContextInfo)
                          (local_78,0x1081,uVar11,pvVar7,(size_t *)0x0);
        this_00 = local_38;
        __mutex = local_88;
        if ((cVar3 == 0) && (local_7c != 0)) {
          uVar11 = 0;
          do {
            local_50[0] = 0;
            (*(local_90->m_Dispatch).clGetProgramBuildInfo)
                      (pSVar5->Program,*(cl_device_id *)((long)pvVar7 + uVar11 * 8),0x1183,0,
                       (void *)0x0,local_50);
            sVar1 = local_50[0];
            __s = (char *)operator_new__(local_50[0] + 1);
            (*(local_90->m_Dispatch).clGetProgramBuildInfo)
                      (pSVar5->Program,*(cl_device_id *)((long)pvVar7 + uVar11 * 8),0x1183,sVar1,__s
                       ,(size_t *)0x0);
            __s[local_50[0]] = '\0';
            local_70[0] = local_60;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_70,"-------> Start of Build Log:\n","");
            log(local_90,(double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
            if (local_70[0] != local_60) {
              operator_delete(local_70[0]);
            }
            local_70[0] = local_60;
            sVar8 = strlen(__s);
            std::__cxx11::string::_M_construct<char_const*>((string *)local_70,__s,__s + sVar8);
            log(local_90,(double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01));
            if (local_70[0] != local_60) {
              operator_delete(local_70[0]);
            }
            local_70[0] = local_60;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_70,"<------- End of Build Log!\n","");
            log(local_90,(double)CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02));
            if (local_70[0] != local_60) {
              operator_delete(local_70[0]);
            }
            operator_delete__(__s);
            uVar11 = uVar11 + 1;
            this_00 = local_38;
            __mutex = local_88;
          } while (uVar11 < local_7c);
        }
      }
    }
    if (local_94 == 0) {
      p_Var9 = (*(local_90->m_Dispatch).clCreateKernel)
                         (pSVar5->Program,"block_motion_estimate_intel",&local_94);
      pSVar5->Kernel_block_motion_estimate_intel = p_Var9;
    }
    if (local_94 == 0) {
      ppSVar4 = std::
                map<_cl_context_*,_CLIntercept::SBuiltinKernelOverrides_*,_std::less<_cl_context_*>,_std::allocator<std::pair<_cl_context_*const,_CLIntercept::SBuiltinKernelOverrides_*>_>_>
                ::operator[](this_00,&local_78);
      *ppSVar4 = pSVar5;
    }
    else {
      operator_delete(pSVar5);
    }
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_70,"... builtin kernel override initialization complete.\n","");
    log(local_90,(double)CONCAT44(extraout_XMM0_Db_03,extraout_XMM0_Da_03));
    if (local_70[0] != local_60) {
      operator_delete(local_70[0]);
    }
    pthread_mutex_unlock(__mutex);
    return;
  }
  uVar10 = std::__throw_system_error(iVar2);
  pthread_mutex_unlock(local_88);
  _Unwind_Resume(uVar10);
}

Assistant:

void CLIntercept::initBuiltinKernelOverrides(
    const cl_context context )
{
    std::lock_guard<std::mutex> lock(m_Mutex);
    log( "Initializing builtin kernel overrides...\n" );

    cl_int  errorCode = CL_SUCCESS;

    // Check to see if overrides already exist.  If they do, release them.
    SBuiltinKernelOverrides*    pOverrides =
        m_BuiltinKernelOverridesMap[ context ];
    if( pOverrides )
    {
        errorCode = dispatch().clReleaseKernel( pOverrides->Kernel_block_motion_estimate_intel );

        errorCode = dispatch().clReleaseProgram( pOverrides->Program );

        delete pOverrides;
        pOverrides = NULL;

        m_BuiltinKernelOverridesMap[ context ] = NULL;
    }

    // Allocate new overrides.
    pOverrides = new SBuiltinKernelOverrides;
    if( pOverrides )
    {
        pOverrides->Program = NULL;

        pOverrides->Kernel_block_motion_estimate_intel = NULL;

        const char* pProgramString = NULL;
        size_t  programStringLength = 0;

        // Get the builtin kernel program string.
        if( errorCode == CL_SUCCESS )
        {
            if( m_OS.GetBuiltinKernelString(
                    pProgramString,
                    programStringLength ) == false )
            {
                errorCode = CL_INVALID_VALUE;
            }
        }

        // Create the program:
        if( errorCode == CL_SUCCESS )
        {
            pOverrides->Program = dispatch().clCreateProgramWithSource(
                context,
                1,
                &pProgramString,
                &programStringLength,
                &errorCode );
        }

        // Build the program:
        if( errorCode == CL_SUCCESS )
        {
            errorCode = dispatch().clBuildProgram(
                pOverrides->Program,
                0,
                NULL,
                "-Dcl_intel_device_side_vme_enable -DHW_NULL_CHECK",
                NULL,
                NULL );

            if( errorCode != CL_SUCCESS )
            {
                cl_int  tempErrorCode = CL_SUCCESS;

                // Get the number of devices for this context.
                cl_uint numDevices = 0;
                tempErrorCode = dispatch().clGetContextInfo(
                    context,
                    CL_CONTEXT_NUM_DEVICES,
                    sizeof( numDevices ),
                    &numDevices,
                    NULL );

                if( numDevices != 0 )
                {
                    cl_device_id*   devices = new cl_device_id[ numDevices ];
                    if( devices )
                    {
                        tempErrorCode = dispatch().clGetContextInfo(
                            context,
                            CL_CONTEXT_DEVICES,
                            numDevices * sizeof( cl_device_id ),
                            devices,
                            NULL );

                        if( tempErrorCode == CL_SUCCESS )
                        {
                            for( cl_uint i = 0; i < numDevices; i++ )
                            {
                                size_t  buildLogSize = 0;
                                dispatch().clGetProgramBuildInfo(
                                    pOverrides->Program,
                                    devices[ i ],
                                    CL_PROGRAM_BUILD_LOG,
                                    0,
                                    NULL,
                                    &buildLogSize );

                                char*   buildLog = new char[ buildLogSize + 1 ];
                                if( buildLog )
                                {
                                    dispatch().clGetProgramBuildInfo(
                                        pOverrides->Program,
                                        devices[ i ],
                                        CL_PROGRAM_BUILD_LOG,
                                        buildLogSize * sizeof( char ),
                                        buildLog,
                                        NULL );

                                    buildLog[ buildLogSize ] = '\0';

                                    log( "-------> Start of Build Log:\n" );
                                    log( buildLog );
                                    log( "<------- End of Build Log!\n" );

                                    delete [] buildLog;
                                }
                            }
                        }
                    }
                }
            }
        }

        // Create all of the kernels in the program:

        if( errorCode == CL_SUCCESS )
        {
            pOverrides->Kernel_block_motion_estimate_intel = dispatch().clCreateKernel(
                pOverrides->Program,
                "block_motion_estimate_intel",
                &errorCode );
        }

        if( errorCode == CL_SUCCESS )
        {
            m_BuiltinKernelOverridesMap[ context ] = pOverrides;
        }
        else
        {
            delete pOverrides;
            pOverrides = NULL;
        }
    }

    log( "... builtin kernel override initialization complete.\n" );
}